

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_binary_ptr_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  char *op_local;
  string local_90;
  string local_70;
  string local_50;
  
  op_local = op;
  bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,op0);
  if (bVar1) {
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,op1);
  }
  else {
    bVar1 = false;
  }
  to_ptr_expression_abi_cxx11_(&local_70,this,op0,true);
  to_ptr_expression_abi_cxx11_(&local_90,this,op1,true);
  join<std::__cxx11::string,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string>
            (&local_50,(spirv_cross *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
             (char (*) [2])&op_local,(char **)0x36c2c9,(char (*) [2])&local_90,
             in_stack_ffffffffffffff58);
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_50,bVar1,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  Compiler::inherit_expression_dependencies((Compiler *)this,result_id,op0);
  Compiler::inherit_expression_dependencies((Compiler *)this,result_id,op1);
  return;
}

Assistant:

void CompilerMSL::emit_binary_ptr_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1, const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1);
	emit_op(result_type, result_id, join(to_ptr_expression(op0), " ", op, " ", to_ptr_expression(op1)), forward);
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}